

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O0

void safe_resizeBuffer(csafestring_t *obj,size_t newLength)

{
  void *__src;
  bool bVar1;
  void *__dest;
  size_t __n;
  long in_RSI;
  undefined8 *in_RDI;
  char *tmp;
  char hit;
  
  bVar1 = false;
  while ((ulong)in_RDI[1] < in_RSI + 1U) {
    bVar1 = true;
    in_RDI[1] = in_RDI[1] << 1;
  }
  if (bVar1) {
    __dest = calloc(1,in_RDI[1]);
    __src = (void *)*in_RDI;
    __n = strlen((char *)*in_RDI);
    memmove(__dest,__src,__n);
    free((void *)*in_RDI);
    *in_RDI = __dest;
  }
  return;
}

Assistant:

void safe_resizeBuffer(csafestring_t *obj, size_t newLength) {
	char hit = 0;
	newLength++;

	while ( obj->buffer_length < newLength ) {
		hit = 1;
		obj->buffer_length <<= 1;
#ifdef EXPERIMENTAL_SIZING
		obj->sizing_size++;
		sizing_size++;
#endif
	}
	if ( hit ) {
		char *tmp = (char *) calloc(sizeof(char), obj->buffer_length);
		memmove(tmp, obj->data, strlen(obj->data));
		free(obj->data);
		obj->data = tmp;
	}
}